

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.h
# Opt level: O2

DEdgeVec *
libDAI::MinSpanningTreePrims<double>(DEdgeVec *__return_storage_ptr__,WeightedGraph<double> *Graph)

{
  size_t *psVar1;
  size_type __n;
  size_t sVar2;
  _Base_ptr p_Var3;
  pointer pDVar4;
  size_type sVar5;
  long lVar6;
  pointer pDVar7;
  _Self __tmp;
  long lVar8;
  size_t e;
  long lVar9;
  size_t i;
  size_t sVar10;
  long lVar11;
  DEdge local_118;
  long local_100;
  long local_f8;
  size_t root;
  vector<double,_std::allocator<double>_> weights;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  edges;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> nodes;
  boostGraph g;
  
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (Graph->
        super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
        )._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (__n != 0) {
    nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &nodes._M_t._M_impl.super__Rb_tree_header._M_header;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    edges.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edges.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    edges.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve(&edges,__n);
    std::vector<double,_std::allocator<double>_>::reserve
              (&weights,(Graph->
                        super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                        )._M_t._M_impl.super__Rb_tree_header._M_node_count);
    for (p_Var3 = (Graph->
                  super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(Graph->
         super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
         )._M_t._M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3))
    {
      std::vector<double,_std::allocator<double>_>::push_back
                (&weights,(value_type_conflict3 *)&p_Var3[1]._M_left);
      g.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = *(_List_node_base **)(p_Var3 + 1);
      g.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)p_Var3[1]._M_parent;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&edges,(pair<unsigned_long,_unsigned_long> *)&g);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&nodes,(unsigned_long *)(p_Var3 + 1));
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&nodes,(unsigned_long *)&p_Var3[1]._M_parent);
    }
    boost::
    adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>
    ::
    adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>
                *)&g,(__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      )edges.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                )edges.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,0,(no_property *)&p);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&p,(long)g.super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)g.super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_118)
    ;
    boost::
    prim_minimum_spanning_tree<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,unsigned_long*>
              (&g,p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start);
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::reserve
              (__return_storage_ptr__,nodes._M_t._M_impl.super__Rb_tree_header._M_node_count - 1);
    root = 0;
    for (sVar10 = 0;
        sVar10 != (long)p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3; sVar10 = sVar10 + 1) {
      sVar2 = sVar10;
      if (sVar10 != p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar10]) {
        local_118.n1 = p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar10];
        local_118.n2 = sVar10;
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::emplace_back<libDAI::DEdge>
                  (__return_storage_ptr__,&local_118);
        sVar2 = root;
      }
      root = sVar2;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase(&nodes._M_t,&root);
    local_f8 = -8;
    local_100 = 0;
    lVar8 = 0;
LAB_004ffdd7:
    pDVar7 = (__return_storage_ptr__->
             super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while (pDVar4 = (__return_storage_ptr__->
                    super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                    super__Vector_impl_data._M_finish, lVar6 = local_100, lVar9 = lVar8,
          lVar11 = local_f8, lVar8 != (long)pDVar4 - (long)pDVar7 >> 4) {
      for (; lVar9 != (long)pDVar4 - (long)pDVar7 >> 4; lVar9 = lVar9 + 1) {
        sVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&nodes._M_t,(key_type *)((long)&pDVar7->n1 + lVar6));
        if (sVar5 == 0) {
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::erase(&nodes._M_t,
                  (key_type *)
                  ((long)(__return_storage_ptr__->
                         super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                         super__Vector_impl_data._M_start - lVar11));
          pDVar7 = (__return_storage_ptr__->
                   super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_118.n1 = pDVar7[lVar8].n1;
          local_118.n2 = pDVar7[lVar8].n2;
          local_f8 = local_f8 + -0x10;
          psVar1 = (size_t *)((long)&pDVar7->n1 + lVar6);
          sVar10 = psVar1[1];
          pDVar7[lVar8].n1 = *psVar1;
          pDVar7[lVar8].n2 = sVar10;
          psVar1 = (size_t *)((long)&pDVar7->n1 + lVar6);
          *psVar1 = local_118.n1;
          psVar1[1] = local_118.n2;
          local_100 = local_100 + 0x10;
          lVar8 = lVar8 + 1;
          goto LAB_004ffdd7;
        }
        pDVar7 = (__return_storage_ptr__->
                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pDVar4 = (__return_storage_ptr__->
                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar6 = lVar6 + 0x10;
        lVar11 = lVar11 + -0x10;
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
    ::~adjacency_list(&g);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&weights.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Vector_base(&edges.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   );
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&nodes._M_t);
  }
  return __return_storage_ptr__;
}

Assistant:

DEdgeVec MinSpanningTreePrims( const WeightedGraph<T> & Graph ) {
        DEdgeVec result;
        if( Graph.size() > 0 ) {
            using namespace boost;
            using namespace std;
            typedef adjacency_list< vecS, vecS, undirectedS, property<vertex_distance_t, int>, property<edge_weight_t, double> > boostGraph;
            typedef pair<size_t, size_t> E;

            set<size_t> nodes;
            vector<E> edges;
            vector<double> weights;
            edges.reserve( Graph.size() );
            weights.reserve( Graph.size() );
            for( typename WeightedGraph<T>::const_iterator e = Graph.begin(); e != Graph.end(); e++ ) {
                weights.push_back( e->second );
                edges.push_back( E( e->first.n1, e->first.n2 ) );
                nodes.insert( e->first.n1 );
                nodes.insert( e->first.n2 );
            }

            boostGraph g( edges.begin(), edges.end(), weights.begin(), nodes.size() );
            vector< graph_traits< boostGraph >::vertex_descriptor > p( num_vertices(g) );
            prim_minimum_spanning_tree( g, &(p[0]) );

            // Store tree edges in result
            result.reserve( nodes.size() - 1 );
            size_t root = 0;
            for( size_t i = 0; i != p.size(); i++ )
                if( p[i] != i )
                    result.push_back( DEdge( p[i], i ) );
                else
                    root = i;

            // We have to store the minimum spanning tree in the right
            // order, such that for all (i1, j1), (i2, j2) in result,
            // if j1 == i2 then (i1, j1) comes before (i2, j2) in result.
            // We do this by reordering the contents of result, effectively
            // growing the tree starting at the root. At each step, 
            // result[0..N-1] are the edges already added to the tree,
            // whereas the other elements of result still have to be added.
            // The elements of nodes are the vertices that still have to
            // be added to the tree.

            // Start with the root
            nodes.erase( root );
            size_t N = 0;

            // Iteratively add edges and nodes to the growing tree
            while( N != result.size() ) {
                for( size_t e = N; e != result.size(); e++ ) {
                    bool e1_in_tree = !nodes.count( result[e].n1 );
                    if( e1_in_tree ) {
                        nodes.erase( result[e].n2 );
                        swap( result[N], result[e] );
                        N++;
                        break;
                    }
                }
            }
        }

        return result;
    }